

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCTestResourceSpec::Resource> * __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec::Resource>::
BindPrivate(Object<cmCTestResourceSpec::Resource> *this,string_view *name,MemberFunction *func,
           bool required)

{
  MemberFunction *this_00;
  Member local_58;
  
  this_00 = &local_58.Function;
  local_58.Function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.Function._M_invoker = (_Invoker_type)0x0;
  local_58.Function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_58.Function.super__Function_base._M_functor._8_8_ = 0;
  local_58.Name._M_len = name->_M_len;
  local_58.Name._M_str = name->_M_str;
  std::
  function<cmCTestResourceSpec::ReadFileResult_(cmCTestResourceSpec::Resource_&,_const_Json::Value_*)>
  ::operator=(this_00,func);
  local_58.Required = required;
  std::
  vector<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec::Resource>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec::Resource>::Member>_>
  ::
  emplace_back<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec::Resource>::Member>
            (&this->Members,&local_58);
  if (required) {
    this->AnyRequired = true;
  }
  if (local_58.Function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.Function.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }